

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format.cc
# Opt level: O2

size_t google::protobuf::internal::WireFormat::ComputeUnknownFieldsSize
                 (UnknownFieldSet *unknown_fields)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  const_reference this;
  uint64_t uVar4;
  UnknownFieldSet *unknown_fields_00;
  size_t sVar5;
  size_t sVar6;
  long lVar7;
  int i;
  int index;
  string_view sVar8;
  
  index = 0;
  sVar6 = 0;
  do {
    iVar2 = RepeatedField<google::protobuf::UnknownField>::size(&unknown_fields->fields_);
    if (iVar2 <= index) {
      return sVar6;
    }
    this = RepeatedField<google::protobuf::UnknownField>::Get(&unknown_fields->fields_,index);
    switch(this->type_) {
    case 0:
      uVar3 = this->number_ * 8 + 1;
      iVar2 = 0x1f;
      if (uVar3 != 0) {
        for (; uVar3 >> iVar2 == 0; iVar2 = iVar2 + -1) {
        }
      }
      uVar4 = UnknownField::varint(this);
      lVar7 = 0x3f;
      if ((uVar4 | 1) != 0) {
        for (; (uVar4 | 1) >> lVar7 == 0; lVar7 = lVar7 + -1) {
        }
      }
      lVar7 = ((int)lVar7 * 9 + 0x49U >> 6) + sVar6;
      goto LAB_002897dc;
    case 1:
      uVar3 = this->number_ * 8 + 5;
      iVar2 = 0x1f;
      if (uVar3 != 0) {
        for (; uVar3 >> iVar2 == 0; iVar2 = iVar2 + -1) {
        }
      }
      sVar6 = sVar6 + (iVar2 * 9 + 0x49U >> 6) + 4;
      break;
    case 2:
      uVar3 = this->number_ * 8 + 1;
      iVar2 = 0x1f;
      if (uVar3 != 0) {
        for (; uVar3 >> iVar2 == 0; iVar2 = iVar2 + -1) {
        }
      }
      sVar6 = sVar6 + (iVar2 * 9 + 0x49U >> 6) + 8;
      break;
    case 3:
      uVar3 = this->number_ * 8 + 3;
      iVar2 = 0x1f;
      if (uVar3 != 0) {
        for (; uVar3 >> iVar2 == 0; iVar2 = iVar2 + -1) {
        }
      }
      sVar8 = UnknownField::length_delimited(this);
      uVar3 = (uint)sVar8._M_len | 1;
      iVar1 = 0x1f;
      if (uVar3 != 0) {
        for (; uVar3 >> iVar1 == 0; iVar1 = iVar1 + -1) {
        }
      }
      sVar8 = UnknownField::length_delimited(this);
      lVar7 = sVar8._M_len + sVar6 + (ulong)(iVar1 * 9 + 0x49U >> 6);
LAB_002897dc:
      sVar6 = lVar7 + (ulong)(iVar2 * 9 + 0x49U >> 6);
      break;
    case 4:
      uVar3 = this->number_ * 8 + 3;
      iVar2 = 0x1f;
      if (uVar3 != 0) {
        for (; uVar3 >> iVar2 == 0; iVar2 = iVar2 + -1) {
        }
      }
      unknown_fields_00 = UnknownField::group(this);
      sVar5 = ComputeUnknownFieldsSize(unknown_fields_00);
      uVar3 = this->number_ * 8 + 5;
      iVar1 = 0x1f;
      if (uVar3 != 0) {
        for (; uVar3 >> iVar1 == 0; iVar1 = iVar1 + -1) {
        }
      }
      sVar6 = sVar5 + sVar6 + (ulong)(iVar2 * 9 + 0x49U >> 6) + (ulong)(iVar1 * 9 + 0x49U >> 6);
    }
    index = index + 1;
  } while( true );
}

Assistant:

size_t WireFormat::ComputeUnknownFieldsSize(
    const UnknownFieldSet& unknown_fields) {
  size_t size = 0;
  for (int i = 0; i < unknown_fields.field_count(); i++) {
    const UnknownField& field = unknown_fields.field(i);

    switch (field.type()) {
      case UnknownField::TYPE_VARINT:
        size += io::CodedOutputStream::VarintSize32(WireFormatLite::MakeTag(
            field.number(), WireFormatLite::WIRETYPE_VARINT));
        size += io::CodedOutputStream::VarintSize64(field.varint());
        break;
      case UnknownField::TYPE_FIXED32:
        size += io::CodedOutputStream::VarintSize32(WireFormatLite::MakeTag(
            field.number(), WireFormatLite::WIRETYPE_FIXED32));
        size += sizeof(int32_t);
        break;
      case UnknownField::TYPE_FIXED64:
        size += io::CodedOutputStream::VarintSize32(WireFormatLite::MakeTag(
            field.number(), WireFormatLite::WIRETYPE_FIXED64));
        size += sizeof(int64_t);
        break;
      case UnknownField::TYPE_LENGTH_DELIMITED:
        size += io::CodedOutputStream::VarintSize32(WireFormatLite::MakeTag(
            field.number(), WireFormatLite::WIRETYPE_LENGTH_DELIMITED));
        size += io::CodedOutputStream::VarintSize32(
            field.length_delimited().size());
        size += field.length_delimited().size();
        break;
      case UnknownField::TYPE_GROUP:
        size += io::CodedOutputStream::VarintSize32(WireFormatLite::MakeTag(
            field.number(), WireFormatLite::WIRETYPE_START_GROUP));
        size += ComputeUnknownFieldsSize(field.group());
        size += io::CodedOutputStream::VarintSize32(WireFormatLite::MakeTag(
            field.number(), WireFormatLite::WIRETYPE_END_GROUP));
        break;
    }
  }

  return size;
}